

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Light,pstd::pmr::polymorphic_allocator<pbrt::Light>>::vector<pbrt::Light_const*>
          (vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *this,Light *first,
          Light *last,polymorphic_allocator<pbrt::Light> *alloc)

{
  uint64_t *in_RCX;
  vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *in_RDX;
  vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *in_RSI;
  Light *in_RDI;
  Light *iter;
  size_t i;
  
  (in_RDI->
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  ).bits = *in_RCX;
  in_RDI[1].
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  in_RDI[2].
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  in_RDI[3].
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = 0;
  vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::reserve
            (in_RSI,(size_t)in_RDX);
  for (; in_RSI != in_RDX;
      in_RSI = (vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)&in_RSI->ptr)
  {
    pmr::polymorphic_allocator<pbrt::Light>::construct<pbrt::Light,pbrt::Light_const&>
              (&in_RSI->alloc,in_RDI,(Light *)0x667d47);
  }
  in_RDI[3].
  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  .bits = in_RDI[2].
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  return;
}

Assistant:

vector(InputIt first, InputIt last, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(last - first);
        size_t i = 0;
        for (InputIt iter = first; iter != last; ++iter, ++i)
            this->alloc.template construct<T>(ptr + i, *iter);
        nStored = nAlloc;
    }